

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O1

double testExtendedKalmanFilter(void)

{
  double **ppdVar1;
  double *pdVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Scalar SVar6;
  double dVar7;
  LhsNested pMVar8;
  variable_if_dynamic<long,__1> vVar9;
  Index IVar10;
  undefined8 __ptr;
  undefined8 uVar11;
  LhsNested pMVar12;
  RhsNested RVar13;
  DenseStorage<double,__1,__1,__1,_0> *pDVar14;
  DenseStorage<double,__1,__1,__1,_0> *pDVar15;
  int iVar16;
  Index size;
  DenseStorage<double,__1,__1,__1,_0> *pDVar17;
  undefined8 *puVar18;
  void *pvVar19;
  double *pdVar20;
  Index IVar21;
  char *pcVar22;
  Index index;
  ulong uVar23;
  ActualDstType actualDst_1;
  long lVar24;
  long lVar25;
  long lVar26;
  ActualDstType actualDst;
  DenseStorage<double,__1,__1,__1,_0> **ppDVar27;
  Index dstRows;
  undefined4 uVar28;
  undefined4 uVar29;
  StateVector x;
  Pmatrix p;
  Qmatrix q;
  StateVector xh;
  StateVector error;
  Rmatrix r;
  Cmatrix c;
  KalmanFunctor func;
  StateVector dx;
  Qmatrix q1;
  Rmatrix r1;
  InputVector uk [1001];
  StateVector xk [1001];
  MeasureVector yk [1000];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_bd98;
  scalar_sum_op<double,_double> local_bd69;
  DenseStorage<double,__1,__1,__1,_0> local_bd68;
  void *local_bd50;
  DenseStorage<double,__1,__1,__1,_0> *local_bd48;
  undefined1 local_bd38 [16];
  DenseStorage<double,__1,__1,__1,_0> *local_bd28;
  long lStack_bd20;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_bd18;
  Matrix<double,__1,__1,_0,__1,__1> local_bd00;
  double local_bce8;
  StateVector local_bce0;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_bcd0;
  DenseStorage<double,__1,__1,__1,_0> *local_bcc8;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_bcc0;
  void *local_bcb8;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_bcb0;
  DenseStorage<double,__1,__1,__1,_0> *local_bca8;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_bca0;
  Matrix<double,__1,__1,_0,__1,__1> local_bc98;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_bc80;
  DenseStorage<double,__1,__1,__1,_0> *local_bc78;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_bc70;
  void *local_bc68 [2];
  Matrix<double,__1,_1,_0,__1,_1> local_bc58;
  Matrix<double,__1,_1,_0,__1,_1> local_bc48;
  DenseStorage<double,__1,__1,__1,_0> local_bc38;
  DenseStorage<double,__1,__1,__1,_0> local_bc20;
  DenseStorage<double,__1,__1,__1,_0> local_bc08;
  DenseStorage<double,__1,__1,__1,_0> local_bbf0;
  double *local_bbd8;
  DenseStorage<double,__1,__1,__1,_0> *apDStack_bbd0 [2001];
  DenseStorage<double,__1,__1,_1,_0> local_7d48;
  double *local_7d38 [1998];
  DenseStorage<double,__1,__1,__1,_0> local_3ec8;
  long local_3eb0;
  DenseStorage<double,__1,__1,_1,_0> aDStack_3ea8 [999];
  
  if ((testExtendedKalmanFilter()::f == '\0') &&
     (iVar16 = __cxa_guard_acquire(&testExtendedKalmanFilter()::f), iVar16 != 0)) {
    stateObservation::ExtendedKalmanFilter::ExtendedKalmanFilter
              ((ExtendedKalmanFilter *)testExtendedKalmanFilter()::f,4,3,1,true,true);
    __cxa_atexit(stateObservation::ExtendedKalmanFilter::~ExtendedKalmanFilter,
                 testExtendedKalmanFilter()::f,&__dso_handle);
    __cxa_guard_release(&testExtendedKalmanFilter()::f);
  }
  memset(&local_7d48,0,0x3e90);
  memset(&local_3ec8.m_cols,0,16000);
  memset(&local_bbd8,0,0x3e90);
  stateObservation::KalmanFilterBase::getRmatrixRandom();
  if (-1 < (local_bd98.m_rhs.m_cols.m_value | local_bd98.m_rhs.m_rows.m_value)) {
    local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         local_bd98.m_rhs.m_rows.m_value;
    pDStack_bcd0 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_cols.m_value;
    local_bcc8 = (DenseStorage<double,__1,__1,__1,_0> *)0x3f847ae147ae147b;
    local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)&local_bd98;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_bc20,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                *)&local_bce0);
    free(local_bd98.m_lhs);
    stateObservation::KalmanFilterBase::getQmatrixRandom();
    if (-1 < (local_bd98.m_rhs.m_cols.m_value | local_bd98.m_rhs.m_rows.m_value)) {
      local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           local_bd98.m_rhs.m_rows.m_value;
      pDStack_bcd0 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_cols.m_value;
      local_bcc8 = (DenseStorage<double,__1,__1,__1,_0> *)0x3f847ae147ae147b;
      local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)&local_bd98;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_bc38,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_bce0);
      free(local_bd98.m_lhs);
      stateObservation::DynamicalSystemFunctorBase::DynamicalSystemFunctorBase
                ((DynamicalSystemFunctorBase *)&local_bce0);
      local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)&PTR__KalmanFunctor_0011ebe8;
      local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
      ;
      pDStack_bcd0 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      local_bcc8 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      pDStack_bcc0 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      local_bcb8 = (void *)0x0;
      pDStack_bcb0 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      local_bca8 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      pDStack_bca0 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      local_bc98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_bc98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           0;
      local_bc98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           0;
      pDStack_bc80 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      local_bc78 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      pDStack_bc70 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      stateObservation::ObserverBase::stateVectorRandom();
      vVar9.m_value = local_bd98.m_rhs.m_rows.m_value;
      pMVar8 = local_bd98.m_lhs;
      if (-1 < local_bd98.m_rhs.m_rows.m_value) {
        if (pDStack_bcd0 != (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_rows.m_value)
        {
          pDVar17 = (DenseStorage<double,__1,__1,__1,_0> *)
                    local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows;
          if (pDStack_bcd0 != (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_rows.m_value
             ) {
            free((void *)local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows);
            if ((DenseStorage<double,__1,__1,__1,_0> *)vVar9.m_value ==
                (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
              pDVar17 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
            }
            else {
              if ((DenseStorage<double,__1,__1,__1,_0> *)0x1fffffffffffffff < (ulong)vVar9.m_value)
              {
LAB_001037b9:
                puVar18 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar18 = operator_delete;
                __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              pDVar17 = (DenseStorage<double,__1,__1,__1,_0> *)malloc(vVar9.m_value * 8);
              if ((DenseStorage<double,__1,__1,__1,_0> *)vVar9.m_value !=
                  (DenseStorage<double,__1,__1,__1,_0> *)0x1 && ((ulong)pDVar17 & 0xf) != 0)
              goto LAB_0010450c;
              if (pDVar17 == (DenseStorage<double,__1,__1,__1,_0> *)0x0) goto LAB_001037b9;
            }
          }
          local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               = (Index)pDVar17;
          pDStack_bcd0 = (DenseStorage<double,__1,__1,__1,_0> *)vVar9.m_value;
        }
        if (pDStack_bcd0 != (DenseStorage<double,__1,__1,__1,_0> *)vVar9.m_value) {
LAB_00104561:
          pcVar22 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
          ;
LAB_00104496:
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar22);
        }
        uVar23 = (long)pDStack_bcd0 - ((long)pDStack_bcd0 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)pDStack_bcd0) {
          lVar24 = 0;
          do {
            ppdVar1 = (double **)
                      ((long)&pMVar8->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                      lVar24 * 8);
            dVar7 = (double)ppdVar1[1];
            ((double **)
            local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows)[lVar24] = (double *)((double)*ppdVar1 * 0.1);
            ((double **)
             local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows + lVar24)[1] = (double *)(dVar7 * 0.1);
            lVar24 = lVar24 + 2;
          } while (lVar24 < (long)uVar23);
        }
        if ((long)uVar23 < (long)pDStack_bcd0) {
          do {
            ((double **)
            local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows)[uVar23] =
                 (double *)
                 ((double)*(double **)
                           ((long)&pMVar8->
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           + uVar23 * 8) * 0.1);
            uVar23 = uVar23 + 1;
          } while (pDStack_bcd0 != (DenseStorage<double,__1,__1,__1,_0> *)uVar23);
        }
        free(local_bd98.m_lhs);
        stateObservation::ObserverBase::measureVectorRandom();
        vVar9.m_value = local_bd98.m_rhs.m_rows.m_value;
        pMVar8 = local_bd98.m_lhs;
        if (-1 < local_bd98.m_rhs.m_rows.m_value) {
          if (pDStack_bcb0 != (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_rows.m_value
             ) {
            pvVar19 = local_bcb8;
            if (pDStack_bcb0 !=
                (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_rows.m_value) {
              free(local_bcb8);
              if ((DenseStorage<double,__1,__1,__1,_0> *)vVar9.m_value ==
                  (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
                pvVar19 = (void *)0x0;
              }
              else {
                if ((DenseStorage<double,__1,__1,__1,_0> *)0x1fffffffffffffff < (ulong)vVar9.m_value
                   ) {
LAB_001038f5:
                  puVar18 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar18 = operator_delete;
                  __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                }
                pvVar19 = malloc(vVar9.m_value * 8);
                if ((DenseStorage<double,__1,__1,__1,_0> *)vVar9.m_value !=
                    (DenseStorage<double,__1,__1,__1,_0> *)0x1 && ((ulong)pvVar19 & 0xf) != 0)
                goto LAB_0010450c;
                if (pvVar19 == (void *)0x0) goto LAB_001038f5;
              }
            }
            local_bcb8 = pvVar19;
            pDStack_bcb0 = (DenseStorage<double,__1,__1,__1,_0> *)vVar9.m_value;
          }
          if (pDStack_bcb0 != (DenseStorage<double,__1,__1,__1,_0> *)vVar9.m_value)
          goto LAB_00104561;
          uVar23 = (long)pDStack_bcb0 - ((long)pDStack_bcb0 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)pDStack_bcb0) {
            lVar24 = 0;
            do {
              ppdVar1 = (double **)
                        ((long)&pMVar8->
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                        lVar24 * 8);
              dVar7 = (double)ppdVar1[1];
              pdVar20 = (double *)((long)local_bcb8 + lVar24 * 8);
              *pdVar20 = (double)*ppdVar1 * 0.1;
              pdVar20[1] = dVar7 * 0.1;
              lVar24 = lVar24 + 2;
            } while (lVar24 < (long)uVar23);
          }
          if ((long)uVar23 < (long)pDStack_bcb0) {
            do {
              *(double *)((long)local_bcb8 + uVar23 * 8) =
                   (double)*(double **)
                            ((long)&pMVar8->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                            + uVar23 * 8) * 0.1;
              uVar23 = uVar23 + 1;
            } while (pDStack_bcb0 != (DenseStorage<double,__1,__1,__1,_0> *)uVar23);
          }
          free(local_bd98.m_lhs);
          stateObservation::ObserverBase::stateVectorRandom();
          pDVar14 = pDStack_bcc0;
          pDVar17 = local_bcc8;
          local_bcc8 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_lhs;
          pDStack_bcc0 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_rows.m_value;
          local_bd98.m_lhs = (LhsNested)pDVar17;
          local_bd98.m_rhs.m_rows.m_value = (long)pDVar14;
          free(pDVar17);
          stateObservation::ObserverBase::measureVectorRandom();
          pDVar14 = pDStack_bca0;
          pDVar17 = local_bca8;
          local_bca8 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_lhs;
          pDStack_bca0 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_rows.m_value;
          local_bd98.m_lhs = (LhsNested)pDVar17;
          local_bd98.m_rhs.m_rows.m_value = (long)pDVar14;
          free(pDVar17);
          stateObservation::KalmanFilterBase::getAmatrixRandom();
          if ((local_bd68.m_cols | local_bd68.m_rows) < 0) goto LAB_0010452b;
          local_bd98.m_rhs.m_rows.m_value = local_bd68.m_rows;
          local_bd98.m_rhs.m_cols.m_value = local_bd68.m_cols;
          local_bd98.m_rhs.m_functor.m_other = 0.6;
          local_bd98.m_lhs = (LhsNested)&local_bd68;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
                    (&local_bc98,&local_bd98,(assign_op<double,_double> *)&local_bd18);
          free(local_bd68.m_data);
          stateObservation::KalmanFilterBase::getCmatrixRandom();
          pDVar15 = pDStack_bc70;
          pDVar14 = local_bc78;
          pDVar17 = pDStack_bc80;
          pDStack_bc80 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_lhs;
          local_bd98.m_lhs = (LhsNested)pDVar17;
          local_bc78 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_rows.m_value;
          pDStack_bc70 = (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_cols.m_value;
          local_bd98.m_rhs.m_rows.m_value = (long)pDVar14;
          local_bd98.m_rhs.m_cols.m_value = (long)pDVar15;
          free(pDVar17);
          stateObservation::ObserverBase::stateVectorZero();
          vVar9.m_value = local_bd98.m_rhs.m_rows.m_value;
          pMVar8 = local_bd98.m_lhs;
          if (local_7d48.m_rows != local_bd98.m_rhs.m_rows.m_value) {
            if (local_bd98.m_rhs.m_rows.m_value < 0) {
LAB_00104462:
              __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                            ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                            "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                           );
            }
            free(local_7d48.m_data);
            if ((DenseStorage<double,__1,__1,__1,_0> *)vVar9.m_value ==
                (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
              pdVar20 = (double *)0x0;
            }
            else {
              if ((DenseStorage<double,__1,__1,__1,_0> *)0x1fffffffffffffff < (ulong)vVar9.m_value)
              {
LAB_00103b4b:
                puVar18 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar18 = operator_delete;
                __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              pdVar20 = (double *)malloc(vVar9.m_value * 8);
              if ((DenseStorage<double,__1,__1,__1,_0> *)vVar9.m_value !=
                  (DenseStorage<double,__1,__1,__1,_0> *)0x1 && ((ulong)pdVar20 & 0xf) != 0) {
LAB_0010450c:
                __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                              ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                              "void *Eigen::internal::aligned_malloc(std::size_t)");
              }
              if (pdVar20 == (double *)0x0) goto LAB_00103b4b;
            }
            local_7d48.m_rows = vVar9.m_value;
            local_7d48.m_data = pdVar20;
          }
          if (local_7d48.m_rows != vVar9.m_value) {
LAB_00104481:
            pcVar22 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
            ;
            goto LAB_00104496;
          }
          uVar23 = local_7d48.m_rows - (local_7d48.m_rows >> 0x3f) & 0xfffffffffffffffe;
          if (1 < local_7d48.m_rows) {
            lVar24 = 0;
            do {
              ppdVar1 = (double **)
                        ((long)&pMVar8->
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                        lVar24 * 8);
              dVar7 = (double)ppdVar1[1];
              local_7d48.m_data[lVar24] = (double)*ppdVar1;
              (local_7d48.m_data + lVar24)[1] = dVar7;
              lVar24 = lVar24 + 2;
            } while (lVar24 < (long)uVar23);
          }
          if ((long)uVar23 < local_7d48.m_rows) {
            do {
              local_7d48.m_data[uVar23] =
                   (double)*(double **)
                            ((long)&pMVar8->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                            + uVar23 * 8);
              uVar23 = uVar23 + 1;
            } while (local_7d48.m_rows != uVar23);
          }
          stateObservation::ObserverBase::inputVectorRandom();
          pDVar17 = apDStack_bbd0[0];
          pdVar20 = local_bbd8;
          local_bbd8 = local_bd68.m_data;
          apDStack_bbd0[0] = (DenseStorage<double,__1,__1,__1,_0> *)local_bd68.m_rows;
          local_bd68.m_data = pdVar20;
          local_bd68.m_rows = (Index)pDVar17;
          free(pdVar20);
          lVar24 = 1;
          do {
            stateObservation::ObserverBase::inputVectorRandom();
            pdVar20 = (&local_bbd8)[lVar24 * 2];
            pDVar17 = apDStack_bbd0[lVar24 * 2];
            (&local_bbd8)[lVar24 * 2] = local_bd68.m_data;
            apDStack_bbd0[lVar24 * 2] = (DenseStorage<double,__1,__1,__1,_0> *)local_bd68.m_rows;
            local_bd68.m_data = pdVar20;
            local_bd68.m_rows = (Index)pDVar17;
            free(pdVar20);
            stateObservation::ObserverBase::stateVectorZero();
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_bbf0,&local_bc38);
            IVar21 = stateObservation::ObserverBase::getStateSize();
            stateObservation::tools::ProbabilityLawSimulation::
            getGaussianMatrix<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      ((ProbabilityLawSimulation *)&local_bd68,&local_bc48,
                       (Matrix<double,__1,__1,_0,__1,__1> *)&local_bbf0,IVar21,1);
            free(local_bbf0.m_data);
            free(local_bc48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_data);
            stateObservation::ObserverBase::measureVectorZero();
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_bc08,&local_bc20);
            IVar21 = stateObservation::ObserverBase::getMeasureSize();
            stateObservation::tools::ProbabilityLawSimulation::
            getGaussianMatrix<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      ((ProbabilityLawSimulation *)&local_bd18,&local_bc58,
                       (Matrix<double,__1,__1,_0,__1,__1> *)&local_bc08,IVar21,1);
            free(local_bc08.m_data);
            free(local_bc58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_data);
            lVar26 = lVar24 + -1;
            testExtendedKalmanFilter()::KalmanFunctor::stateDynamics(Eigen::
            Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
                      (&local_bd50,&local_bce0,(InputVector *)&local_bd98,
                       (TimeIndex)(&local_bbd8 + lVar26 * 2));
            pvVar19 = local_bd50;
            IVar10 = local_bd68.m_rows;
            pdVar20 = local_bd68.m_data;
            if (local_bd48 != (DenseStorage<double,__1,__1,__1,_0> *)local_bd68.m_rows) {
LAB_00104443:
              pcVar22 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
              ;
              goto LAB_00104458;
            }
            if (local_bd98.m_rhs.m_rows.m_value != local_bd68.m_rows) {
              if (local_bd68.m_rows < 0) goto LAB_00104462;
              free(local_bd98.m_lhs);
              if ((DenseStorage<double,__1,__1,__1,_0> *)IVar10 ==
                  (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
                pDVar17 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
              }
              else {
                if ((DenseStorage<double,__1,__1,__1,_0> *)0x1fffffffffffffff < (ulong)IVar10) {
LAB_001044de:
                  puVar18 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar18 = operator_delete;
                  __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                }
                pDVar17 = (DenseStorage<double,__1,__1,__1,_0> *)malloc(IVar10 * 8);
                if ((DenseStorage<double,__1,__1,__1,_0> *)IVar10 !=
                    (DenseStorage<double,__1,__1,__1,_0> *)0x1 && ((ulong)pDVar17 & 0xf) != 0)
                goto LAB_0010450c;
                if (pDVar17 == (DenseStorage<double,__1,__1,__1,_0> *)0x0) goto LAB_001044de;
              }
              local_bd98.m_rhs.m_rows.m_value = IVar10;
              local_bd98.m_lhs = (LhsNested)pDVar17;
            }
            vVar9.m_value = local_bd98.m_rhs.m_rows.m_value;
            pMVar8 = local_bd98.m_lhs;
            if (local_bd98.m_rhs.m_rows.m_value != IVar10) {
LAB_0010442c:
              pcVar22 = 
              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
              ;
              goto LAB_00104496;
            }
            uVar23 = local_bd98.m_rhs.m_rows.m_value - (local_bd98.m_rhs.m_rows.m_value >> 0x3f) &
                     0xfffffffffffffffe;
            if (1 < local_bd98.m_rhs.m_rows.m_value) {
              lVar25 = 0;
              do {
                pdVar2 = (double *)((long)pvVar19 + lVar25 * 8);
                pdVar3 = pdVar20 + lVar25;
                dVar7 = pdVar2[1] + pdVar3[1];
                auVar4._8_4_ = SUB84(dVar7,0);
                auVar4._0_8_ = *pdVar2 + *pdVar3;
                auVar4._12_4_ = (int)((ulong)dVar7 >> 0x20);
                *(undefined1 (*) [16])
                 ((long)&(local_bd98.m_lhs)->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                 lVar25 * 8) = auVar4;
                lVar25 = lVar25 + 2;
              } while (lVar25 < (long)uVar23);
            }
            if ((long)uVar23 < local_bd98.m_rhs.m_rows.m_value) {
              do {
                *(double **)
                 ((long)&(local_bd98.m_lhs)->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                 uVar23 * 8) = (double *)(*(double *)((long)pvVar19 + uVar23 * 8) + pdVar20[uVar23])
                ;
                uVar23 = uVar23 + 1;
              } while (local_bd98.m_rhs.m_rows.m_value != uVar23);
            }
            if ((DenseStorage<double,__1,__1,__1,_0> *)local_7d38[lVar24 * 2 + -1] !=
                (DenseStorage<double,__1,__1,__1,_0> *)local_bd98.m_rhs.m_rows.m_value) {
              if (local_bd98.m_rhs.m_rows.m_value < 0) goto LAB_00104462;
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                        (&local_7d48 + lVar24,local_bd98.m_rhs.m_rows.m_value,
                         local_bd98.m_rhs.m_rows.m_value,1);
            }
            pDVar17 = (DenseStorage<double,__1,__1,__1,_0> *)local_7d38[lVar24 * 2 + -1];
            if (pDVar17 != (DenseStorage<double,__1,__1,__1,_0> *)vVar9.m_value) goto LAB_00104481;
            pdVar20 = (&local_7d48)[lVar24].m_data;
            uVar23 = (long)pDVar17 - ((long)pDVar17 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < (long)pDVar17) {
              lVar25 = 0;
              do {
                ppdVar1 = (double **)
                          ((long)&pMVar8->
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                          lVar25 * 8);
                dVar7 = (double)ppdVar1[1];
                pdVar20[lVar25] = (double)*ppdVar1;
                (pdVar20 + lVar25)[1] = dVar7;
                lVar25 = lVar25 + 2;
              } while (lVar25 < (long)uVar23);
            }
            if ((long)uVar23 < (long)pDVar17) {
              do {
                pdVar20[uVar23] =
                     (double)*(double **)
                              ((long)&pMVar8->
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              + uVar23 * 8);
                uVar23 = uVar23 + 1;
              } while (pDVar17 != (DenseStorage<double,__1,__1,__1,_0> *)uVar23);
            }
            free(local_bd50);
            testExtendedKalmanFilter()::KalmanFunctor::measureDynamics(Eigen::
            Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
                      (&local_bd50,&local_bce0,(InputVector *)&local_bd98,(TimeIndex)pdVar20);
            RVar13.m_matrix = local_bd18.m_rhs.m_matrix;
            pMVar12 = local_bd18.m_lhs;
            pvVar19 = local_bd50;
            if (local_bd48 != (DenseStorage<double,__1,__1,__1,_0> *)local_bd18.m_rhs.m_matrix)
            goto LAB_00104443;
            if ((DenseStorage<double,__1,__1,__1,_0> *)(&local_3eb0)[lVar26 * 2] !=
                (DenseStorage<double,__1,__1,__1,_0> *)local_bd18.m_rhs.m_matrix) {
              if ((long)local_bd18.m_rhs.m_matrix < 0) goto LAB_00104462;
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                        (aDStack_3ea8 + lVar24 + -2,(Index)local_bd18.m_rhs.m_matrix,
                         (Index)local_bd18.m_rhs.m_matrix,1);
            }
            pDVar17 = (DenseStorage<double,__1,__1,__1,_0> *)(&local_3eb0)[lVar26 * 2];
            if (pDVar17 != (DenseStorage<double,__1,__1,__1,_0> *)RVar13.m_matrix)
            goto LAB_0010442c;
            pdVar20 = aDStack_3ea8[lVar24 + -2].m_data;
            uVar23 = (long)pDVar17 - ((long)pDVar17 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < (long)pDVar17) {
              lVar26 = 0;
              do {
                pdVar2 = (double *)((long)pvVar19 + lVar26 * 8);
                ppdVar1 = (double **)
                          ((long)&pMVar12->
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                          lVar26 * 8);
                dVar7 = pdVar2[1] + (double)ppdVar1[1];
                auVar5._8_4_ = SUB84(dVar7,0);
                auVar5._0_8_ = *pdVar2 + (double)*ppdVar1;
                auVar5._12_4_ = (int)((ulong)dVar7 >> 0x20);
                *(undefined1 (*) [16])(pdVar20 + lVar26) = auVar5;
                lVar26 = lVar26 + 2;
              } while (lVar26 < (long)uVar23);
            }
            if ((long)uVar23 < (long)pDVar17) {
              do {
                pdVar20[uVar23] =
                     *(double *)((long)pvVar19 + uVar23 * 8) +
                     (double)*(double **)
                              ((long)&pMVar12->
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              + uVar23 * 8);
                uVar23 = uVar23 + 1;
              } while (pDVar17 != (DenseStorage<double,__1,__1,__1,_0> *)uVar23);
            }
            free(local_bd50);
            free(local_bd18.m_lhs);
            free(local_bd68.m_data);
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x3e9);
          free(local_bd98.m_lhs);
          stateObservation::ExtendedKalmanFilter::setFunctor
                    ((DynamicalSystemFunctorBase *)testExtendedKalmanFilter()::f);
          stateObservation::ObserverBase::stateVectorRandom();
          stateObservation::ZeroDelayObserver::setState
                    ((Matrix *)testExtendedKalmanFilter()::f,(long)&local_7d48);
          stateObservation::KalmanFilterBase::getPmatrixZero();
          for (uVar23 = 0; lVar24 = stateObservation::ObserverBase::getStateSize(),
              (long)uVar23 < lVar24; uVar23 = (ulong)((int)uVar23 + 1)) {
            if ((long)local_bd38._8_8_ <= (long)uVar23) {
              __assert_fail("index >= 0 && index < size()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            if ((local_bd68.m_rows <= (long)uVar23) || (local_bd68.m_cols <= (long)uVar23)) {
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                           );
            }
            local_bd68.m_data[local_bd68.m_rows * uVar23 + uVar23] =
                 (double)((double **)local_bd38._0_8_)[uVar23];
          }
          local_bd18.m_lhs = (LhsNested)&local_bd68;
          local_bd18.m_rhs.m_matrix = (non_const_type)&local_bd68;
          Eigen::Matrix<double,-1,-1,0,-1,-1>::
          Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                    ((Matrix<double,_1,_1,0,_1,_1> *)&local_bd98,&local_bd18);
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)&local_bd68,
                     (Matrix<double,__1,__1,_0,__1,__1> *)&local_bd98,
                     (assign_op<double,_double> *)&local_bd50);
          free(local_bd98.m_lhs);
          stateObservation::KalmanFilterBase::setStateCovariance
                    ((Matrix *)testExtendedKalmanFilter()::f);
          local_bd98.m_lhs = (LhsNested)&local_bc20;
          local_bd98.m_rhs.m_rows.m_value = (long)local_bd98.m_lhs;
          Eigen::Matrix<double,-1,-1,0,-1,-1>::
          Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                    ((Matrix<double,_1,_1,0,_1,_1> *)&local_bd18,
                     (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                      *)&local_bd98);
          local_bd98.m_lhs = (LhsNested)&local_bc38;
          local_bd98.m_rhs.m_rows.m_value = (long)local_bd98.m_lhs;
          Eigen::Matrix<double,-1,-1,0,-1,-1>::
          Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                    ((Matrix<double,_1,_1,0,_1,_1> *)&local_bd50,
                     (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                      *)&local_bd98);
          stateObservation::KalmanFilterBase::setR((Matrix *)testExtendedKalmanFilter()::f);
          stateObservation::KalmanFilterBase::setQ((Matrix *)testExtendedKalmanFilter()::f);
          stateObservation::ZeroDelayObserver::setInput
                    ((Matrix *)testExtendedKalmanFilter()::f,(long)&local_bbd8);
          stateObservation::ObserverBase::stateVectorConstant(1.0);
          if (-1 < local_bd00.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows) {
            local_bd98.m_rhs.m_rows.m_value =
                 local_bd00.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
            local_bd98.m_rhs.m_functor.m_other = 1e-08;
            local_bd98.m_lhs = &local_bd00;
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
            PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_bc68,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                        *)&local_bd98);
            free(local_bd00.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data);
            lVar24 = 1;
            ppDVar27 = apDStack_bbd0 + 1;
            pDVar17 = &local_3ec8;
            do {
              pDVar17 = (DenseStorage<double,__1,__1,__1,_0> *)&pDVar17->m_cols;
              stateObservation::ZeroDelayObserver::setMeasurement
                        ((Matrix *)testExtendedKalmanFilter()::f,(long)pDVar17);
              stateObservation::ZeroDelayObserver::setInput
                        ((Matrix *)testExtendedKalmanFilter()::f,(long)ppDVar27);
              stateObservation::ExtendedKalmanFilter::getAMatrixFD((Matrix *)&local_bd98);
              stateObservation::ExtendedKalmanFilter::getCMatrixFD((Matrix *)&local_bd00);
              stateObservation::KalmanFilterBase::setA((Matrix *)testExtendedKalmanFilter()::f);
              stateObservation::KalmanFilterBase::setC((Matrix *)testExtendedKalmanFilter()::f);
              stateObservation::ZeroDelayObserver::getEstimatedState((long)&local_bd28);
              uVar11 = local_bd38._8_8_;
              __ptr = local_bd38._0_8_;
              local_bd38._0_8_ = local_bd28;
              local_bd38._8_8_ = lStack_bd20;
              local_bd28 = (DenseStorage<double,__1,__1,__1,_0> *)__ptr;
              lStack_bd20 = uVar11;
              free((void *)__ptr);
              free(local_bd00.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              free(local_bd98.m_lhs);
              lVar24 = lVar24 + 1;
              ppDVar27 = ppDVar27 + 2;
            } while (lVar24 != 0x3e9);
            local_bd98.m_rhs.m_rows.m_value = (long)&local_3ec8;
            local_bd98.m_lhs = (LhsNested)local_bd38;
            if (local_bd38._8_8_ == local_3ec8.m_rows) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
              PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_bd28,
                         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          *)&local_bd98);
              local_bd00.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data = (double *)&local_bd28;
              if (lStack_bd20 == 0) {
                uVar28 = 0;
                uVar29 = 0;
              }
              else {
                if (lStack_bd20 < 1) {
                  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\""
                                ,"/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                               );
                }
                local_bd98.m_rhs.m_rows.m_value = (long)local_bd28;
                SVar6 = Eigen::internal::
                        redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                        ::
                        run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                  ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                    *)&local_bd98,&local_bd69,
                                   (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                    *)&local_bd00);
                uVar28 = SUB84(SVar6,0);
                uVar29 = (undefined4)((ulong)SVar6 >> 0x20);
              }
              local_bce8 = (double)CONCAT44(uVar29,uVar28);
              free(local_bd28);
              free(local_bc68[0]);
              free(local_bd50);
              free(local_bd18.m_lhs);
              free(local_bd68.m_data);
              free((void *)local_bd38._0_8_);
              local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = (double *)&PTR__KalmanFunctor_0011ebe8;
              free(pDStack_bc80);
              free(local_bc98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              free(local_bca8);
              free(local_bcb8);
              free(local_bcc8);
              free((void *)local_bce0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           .m_storage.m_rows);
              stateObservation::DynamicalSystemFunctorBase::~DynamicalSystemFunctorBase
                        ((DynamicalSystemFunctorBase *)&local_bce0);
              free(local_bc38.m_data);
              free(local_bc20.m_data);
              lVar24 = 0x3e90;
              do {
                free(*(void **)((long)&local_bbf0.m_rows + lVar24));
                lVar24 = lVar24 + -0x10;
              } while (lVar24 != 0);
              lVar24 = 16000;
              do {
                free(*(void **)((long)&local_3ec8.m_data + lVar24));
                lVar24 = lVar24 + -0x10;
              } while (lVar24 != 0);
              lVar24 = 0x3e90;
              do {
                free(*(void **)((long)apDStack_bbd0 + lVar24 + 0x3e78U));
                lVar24 = lVar24 + -0x10;
              } while (lVar24 != 0);
              return SQRT(local_bce8);
            }
            pcVar22 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
LAB_00104458:
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar22);
          }
        }
      }
      pcVar22 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_00104557;
    }
  }
LAB_0010452b:
  pcVar22 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
  ;
LAB_00104557:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar22);
}

Assistant:

double testExtendedKalmanFilter()
{
  /// the number of samples
  const static stateObservation::Index kmax = 1000;

  /// define the type of the extended Kalman filter
  typedef stateObservation::ExtendedKalmanFilter ekf;

  /// instanciation of the extended Kalman filter
  static ekf f(4, 3, 1);

  /// The functor that describes the dynamics of the state
  /// and the measurement
  class KalmanFunctor : public stateObservation::DynamicalSystemFunctorBase
  {

  public:
    /// Constructor
    KalmanFunctor()
    {
      s_ = f.stateVectorRandom() * 0.1;
      m_ = f.measureVectorRandom() * 0.1;
      t_ = f.stateVectorRandom();
      n_ = f.measureVectorRandom();
      a_ = f.getAmatrixRandom() * 0.6;
      c_ = f.getCmatrixRandom();
    }

    /// The dynamics of the state xk1=f(xk,u,k)
    virtual ekf::StateVector stateDynamics(const ekf::StateVector & xk,
                                           const ekf::InputVector & u,
                                           stateObservation::TimeIndex k)
    {
      (void)k; // unused
      (void)u; // unused

      ekf::StateVector xk1;

      xk1 = a_ * xk + cos(10 * (xk.transpose() * xk)[0]) * s_ + t_ + (u.transpose() * u)(0, 0) * s_;
      return xk1;
    }

    /// The dynamics of the state yk=h(xk,u,k)
    virtual ekf::MeasureVector measureDynamics(const ekf::StateVector & xk,
                                               const ekf::InputVector & u,
                                               stateObservation::TimeIndex k)
    {
      (void)k; // unused
      (void)u; // unused

      ekf::MeasureVector yk;
      yk = c_ * xk + cos(10 * (xk.transpose() * xk)[0]) * m_ + n_;
      return yk;
    }

    virtual stateObservation::Index getStateSize() const
    {
      return f.getStateSize();
    }

    virtual stateObservation::Index getInputSize() const
    {
      return f.getInputSize();
    }

    virtual stateObservation::Index getMeasurementSize() const
    {
      return f.getMeasureSize();
    }

  private:
    /// containers for the vectors and matrices
    ekf::StateVector s_;
    ekf::StateVector t_;
    ekf::MeasureVector m_;
    ekf::MeasureVector n_;

    ekf::Amatrix a_;
    ekf::Cmatrix c_;
  };

  /// containers for the state, the measurements and the input
  ekf::StateVector xk[kmax + 1];
  ekf::MeasureVector yk[kmax];
  ekf::InputVector uk[kmax + 1];

  /// the standard deviation matrix to generate the gaussian noise
  ekf::Rmatrix r1 = f.getRmatrixRandom() * 0.01;
  ekf::Qmatrix q1 = f.getQmatrixRandom() * 0.01;

  /// instanciate the functor
  KalmanFunctor func;

  { /// Construction of the sequence of states measurements and inputs

    /// initializations
    ekf::StateVector x = f.stateVectorZero();
    xk[0] = x;
    uk[0] = f.inputVectorRandom();

    for(stateObservation::Index k = 1; k <= kmax; ++k)
    {
      /// generation of random inputs
      uk[k] = f.inputVectorRandom();

      /// generation of Gaussian white noises
      ekf::StateVector v = stateObservation::tools::ProbabilityLawSimulation::getGaussianMatrix(f.stateVectorZero(), q1,
                                                                                                f.getStateSize(), 1);

      ekf::MeasureVector w = stateObservation::tools::ProbabilityLawSimulation::getGaussianMatrix(
          f.measureVectorZero(), r1, f.getMeasureSize());

      /// the dynamics is executed here
      xk[k] = x = func.stateDynamics(x, uk[k - 1], k - 1) + v;
      yk[k - 1] = func.measureDynamics(x, uk[k], k) + w;
    }
  }

  /// set the functor of the extended Kalman filter
  f.setFunctor(&func);

  /// generation of a random initial estimation of the state
  ekf::StateVector xh = f.stateVectorRandom();

  /// set the initial state of the estimator
  f.setState(xk[0], 0);

  /// set the covariance matrix of the initial estimation error
  ekf::Pmatrix p = f.getPmatrixZero();
  for(unsigned i = 0; i < f.getStateSize(); ++i)
  {
    p(i, i) = xh[i];
  }
  p = p * p.transpose();
  f.setStateCovariance(p);

  /// the covariance matrices for the process noise and the measurements noise
  ekf::Rmatrix r(r1 * r1.transpose());
  ekf::Qmatrix q(q1 * q1.transpose());

  /// set the covariance matrices for the extended Kalman filter
  f.setR(r);
  f.setQ(q);

  /// set initial input
  f.setInput(uk[0], 0);

  /// set the derivation step for the finite difference method
  ekf::StateVector dx = f.stateVectorConstant(1) * 1e-8;

  stateObservation::Index i;
  for(i = 1; i <= kmax; ++i)
  {
    /// give the measurements and the inputs at instant i to the ekf
    f.setMeasurement(yk[i - 1], i);
    f.setInput(uk[i], i);

    /// obtain jacobians by finite differences method
    ekf::Amatrix a = f.getAMatrixFD(dx);
    ekf::Cmatrix c = f.getCMatrixFD(dx);

    /// set the jacobians to the ekf
    f.setA(a);
    f.setC(c);

    /// get the estimation of the state at instant i;
    xh = f.getEstimatedState(i);
  }

  ekf::StateVector error = xh - xk[kmax];

  return error.norm();
}